

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

command_node * __thiscall
libchars::command_node::add(command_node *this,string *word,filter_t mask_,bool hidden_)

{
  char cVar1;
  ulong uVar2;
  size_type sVar3;
  command_node *pcVar4;
  undefined8 uVar5;
  debug *pdVar6;
  char *pcVar7;
  command_node *pcVar8;
  command_node **ppcVar9;
  command_node *pcVar10;
  command_node *pcVar11;
  filter_t fVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined1 local_b0 [48];
  string part;
  command_node *local_50;
  ulong local_48;
  
  pdVar6 = debug::initialize(0);
  debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  this->mask = this->mask | mask_;
  pcVar10 = this->head;
  if (pcVar10 == (command_node *)0x0) {
    pcVar10 = (command_node *)debug::initialize(0);
    debug::log((debug *)pcVar10,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
    pcVar10 = add_node(pcVar10,this,word,mask_,hidden_);
    return pcVar10;
  }
  local_48 = 0;
  fVar12 = 0;
  local_50 = this;
  do {
    part.field_2._8_8_ = 0;
    local_b0._32_8_ = fVar12;
    while( true ) {
      while( true ) {
        pcVar11 = pcVar10;
        uVar2 = word->_M_string_length;
        pdVar6 = debug::initialize(0);
        uVar5 = local_b0._32_8_;
        if (uVar2 <= local_48) {
          debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          pdVar6 = debug::initialize(0);
          uVar5 = local_b0._32_8_;
          debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
          if (word->_M_string_length <= local_48) {
            sVar3 = (pcVar11->part)._M_string_length;
            pdVar6 = debug::initialize(0);
            if (local_48 < sVar3 + uVar5) {
              debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
              std::__cxx11::string::string((string *)(local_b0 + 0x28),(string *)pcVar11);
              std::__cxx11::string::assign((string *)pcVar11,(ulong)(local_b0 + 0x28),0);
              pcVar8 = pcVar11->head;
              pcVar4 = pcVar11->tail;
              pcVar11->head = (command_node *)0x0;
              pcVar11->tail = (command_node *)0x0;
              pcVar10 = (command_node *)local_b0;
              std::__cxx11::string::substr((ulong)pcVar10,(ulong)(local_b0 + 0x28));
              pcVar10 = add_node(pcVar10,pcVar11,(string *)local_b0,pcVar11->mask,pcVar11->hidden);
              std::__cxx11::string::~string((string *)local_b0);
              pcVar10->cmd = pcVar11->cmd;
              pcVar10->head = pcVar8;
              pcVar10->tail = pcVar4;
              pcVar10->start = pcVar11->start;
              pcVar11->mask = pcVar11->mask | mask_;
              pcVar11->cmd = (command *)0x0;
              pcVar11->hidden = hidden_;
              pcVar11->start = (command_node *)0x0;
              std::__cxx11::string::~string((string *)(local_b0 + 0x28));
              return pcVar11;
            }
            debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
            pcVar11->mask = pcVar11->mask | mask_;
            return pcVar11;
          }
          pcVar11->mask = pcVar11->mask | mask_;
          pcVar10 = (command_node *)(local_b0 + 0x28);
          pcVar8 = pcVar10;
          std::__cxx11::string::substr((ulong)pcVar10,(ulong)word);
          pcVar10 = add_node(pcVar8,pcVar11,(string *)pcVar10,mask_,hidden_);
          goto LAB_0010ec41;
        }
        debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        pcVar7 = (char *)std::__cxx11::string::at((ulong)word);
        cVar1 = *pcVar7;
        if (fVar12 != uVar5) break;
        pcVar7 = (char *)std::__cxx11::string::at((ulong)pcVar11);
        fVar12 = uVar5;
        if (*pcVar7 == cVar1) goto LAB_0010e88d;
        fVar12 = local_b0._32_8_;
        part.field_2._8_8_ = pcVar11;
        pcVar10 = pcVar11->next;
        if (pcVar11->next == (command_node *)0x0) {
          pcVar10 = (command_node *)(local_b0 + 0x28);
          pcVar11 = pcVar10;
          std::__cxx11::string::substr((ulong)pcVar10,(ulong)word);
          pcVar10 = add_node(pcVar11,local_50,(string *)pcVar10,mask_,hidden_);
          goto LAB_0010ec41;
        }
      }
      if ((pcVar11->part)._M_string_length <= fVar12 - uVar5) break;
      pcVar7 = (char *)std::__cxx11::string::at((ulong)pcVar11);
      if (*pcVar7 != cVar1) {
        pdVar6 = debug::initialize(0);
        debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
        std::__cxx11::string::string((string *)(local_b0 + 0x28),(string *)pcVar11);
        pcVar8 = (command_node *)operator_new(0x58);
        command_node(pcVar8);
        std::__cxx11::string::assign((string *)pcVar8,(ulong)(local_b0 + 0x28),0);
        pcVar8->mask = pcVar11->mask | mask_;
        pcVar8->next = pcVar11->next;
        std::__cxx11::string::substr((ulong)local_b0,(ulong)(local_b0 + 0x28));
        pcVar10 = (command_node *)local_b0;
        std::__cxx11::string::operator=((string *)pcVar11,(string *)pcVar10);
        std::__cxx11::string::~string((string *)pcVar10);
        pcVar11->next = (command_node *)0x0;
        add_node(pcVar10,pcVar8,pcVar11);
        ppcVar9 = (command_node **)(part.field_2._8_8_ + 0x48);
        if (part.field_2._8_8_ == 0) {
          ppcVar9 = &local_50->head;
        }
        *ppcVar9 = pcVar8;
        if (pcVar8->next == (command_node *)0x0) {
          local_50->tail = pcVar8;
        }
        pcVar10 = (command_node *)local_b0;
        std::__cxx11::string::substr((ulong)pcVar10,(ulong)word);
        pcVar10 = add_node(pcVar10,pcVar8,(string *)local_b0,mask_,hidden_);
        std::__cxx11::string::~string((string *)local_b0);
        goto LAB_0010ec41;
      }
LAB_0010e88d:
      local_48 = local_48 + 1;
      fVar12 = fVar12 + 1;
      pcVar10 = pcVar11;
    }
    pcVar10 = pcVar11->head;
    pcVar11->mask = pcVar11->mask | mask_;
    local_50 = pcVar11;
    if (pcVar10 == (command_node *)0x0) {
      pcVar10 = (command_node *)(local_b0 + 0x28);
      pcVar8 = pcVar10;
      std::__cxx11::string::substr((ulong)pcVar10,(ulong)word);
      pcVar10 = add_node(pcVar8,pcVar11,(string *)pcVar10,mask_,hidden_);
LAB_0010ec41:
      std::__cxx11::string::~string((string *)(local_b0 + 0x28));
      return pcVar10;
    }
  } while( true );
}

Assistant:

command_node *command_node::add(const std::string &word, command::filter_t mask_, bool hidden_)
    {
        LC_LOG_VERBOSE("+word[%s] mask[0x%08x] hidden[%s]",word.c_str(),mask_,hidden_?"true":"false");

        mask |= mask_; // always update root mask

        if (head == NULL) {
            // no need to search; just add whole word
            LC_LOG_VERBOSE("add-new-root");
            return add_node(this,word,mask_,hidden_);
        }
        else {
            size_t ti = 0; // tree index (cumulative)
            size_t wi = 0; // index of first character in partial word (wi <= ti)
            size_t si = 0; // index into search word (0..length)

            command_node *root = this;
            command_node *prev = NULL;
            command_node *n = head;

            while (n != NULL && si < word.length()) {
                LC_LOG_VERBOSE("root[%p] prev[%p] n[%p] ti[%zu] wi[%zu] si[%zu]",root,prev,n,ti,wi,si);
                char c = word.at(si);
                size_t ri = (ti - wi); // index relative to partial dictionary word
                if (ri == 0) {
                    // check for match in first letter, else go to next command_node
                    if (n->part.at(ri) == c) {
                        ++si;
                        ++ti;
                    }
                    else if (n->next == NULL) {
                        return add_node(root,word.substr(si),mask_,hidden_);
                    }
                    else {
                        prev = n;
                        n = n->next;
                    }
                }
                else if (ri < n->part.length()) {
                    // check for match in current part
                    if (n->part.at(ri) == c) {
                        ++si;
                        ++ti;
                    }
                    else {
                        // mismatch = split + add new part
                        LC_LOG_VERBOSE("mismatch->split");
                        std::string part = n->part;
                        command_node *nn = new command_node;
                        nn->part.assign(part,0,ri);
                        nn->mask = n->mask | mask_;
                        nn->next = n->next;
                        n->part.assign(part.substr(ri));
                        n->next = NULL;
                        // split = move existing command_node down one level
                        add_node(nn,n);
                        if (prev == NULL) {
                            root->head = nn;
                        }
                        else {
                            prev->next = nn;
                        }
                        if (nn->next == NULL) {
                            root->tail = nn;
                        }
                        return add_node(nn,word.substr(si),mask_,hidden_);
                    }
                }
                else {
                    // reached end of current part; go down one level if possible
                    if (n->head == NULL) {
                        n->mask |= mask_;
                        return add_node(n,word.substr(si),mask_,hidden_);
                    }
                    else {
                        wi = ti;
                        root = n;
                        root->mask |= mask_;
                        prev = NULL;
                        n = n->head;
                    }
                }
            }

            LC_LOG_VERBOSE("END1: root[%p] prev[%p] n[%p] ti[%zu] si[%zu] word.length[%zu]",root,prev,n,ti,si,word.length());

            if (n == NULL) 
                n = root;

            LC_LOG_VERBOSE("END2: n[%p] wi[%zu] part.length[%zu]",n,wi,n->part.length());

            if (si < word.length()) {
                // not found --> add rest of word
                n->mask |= mask_;
                return add_node(n,word.substr(si),mask_,hidden_);
            }
            else if (si < (wi + n->part.length())) {
                // found, but only partially --> split + add new part
                LC_LOG_VERBOSE("found(partially)->split");
                size_t ri = (si - wi); // index relative to partial dictionary word
                std::string part = n->part;
                n->part.assign(part,0,ri);
                command_node *head__ = n->head;
                command_node *tail__ = n->tail;
                // move command node content to new node
                n->head = n->tail = NULL;
                command_node *nn = add_node(n,part.substr(ri),n->mask,n->hidden);
                nn->cmd = n->cmd;
                nn->head = head__;
                nn->tail = tail__;
                nn->start = n->start;
                // clean up current node
                n->mask |= mask_;
                n->cmd = NULL;
                n->hidden = hidden_;
                n->start = NULL;
            }
            else {
                // duplicate
                LC_LOG_VERBOSE("duplicate node");
                n->mask |= mask_;
            }

            return n;
        }
    }